

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O2

ArrayIDIDFunc *
compute_tree_depth_order_of_connected_graph<flow_cutter::ComputeSeparator>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          ComputeSeparator *compute_separator,int tree_depth_must_be_below)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int best_order_depth;
  ArrayIDIDFunc best_order;
  ArrayIDIDFunc nd_order;
  vector<int,_std::allocator<int>_> separator;
  int local_98;
  int local_94;
  ArrayIDIDFunc local_90;
  ArrayIDIDFunc local_78;
  _Vector_base<int,_std::allocator<int>_> local_60;
  anon_class_24_3_8acad44f local_48;
  
  iVar1 = (tail->super_ArrayIDFunc<int>).preimage_count_;
  iVar3 = tail->image_count_;
  local_94 = tree_depth_must_be_below;
  if (iVar1 == iVar3 * 2 + -2) {
    compute_tree_depth_order_of_tree<ArrayIDIDFunc,ArrayIDIDFunc>(__return_storage_ptr__,tail,head);
  }
  else if (iVar1 == (iVar3 + -1) * iVar3) {
    identity_permutation(__return_storage_ptr__,iVar3);
  }
  else {
    compute_greedy_order(&local_90,tail,head);
    iVar1 = compute_tree_depth_of_order(tail,head,&local_90);
    iVar3 = iVar1;
    if (tree_depth_must_be_below <= iVar1) {
      iVar3 = tree_depth_must_be_below;
    }
    local_98 = iVar1;
    flow_cutter::ComputeSeparator::operator()
              ((vector<int,_std::allocator<int>_> *)&local_60,compute_separator,tail,head,iVar3 + -1
              );
    if (local_60._M_impl.super__Vector_impl_data._M_start !=
        local_60._M_impl.super__Vector_impl_data._M_finish) {
      local_48.tree_depth_must_be_below = &local_94;
      local_48.compute_separator = compute_separator;
      local_48.best_order_depth = &local_98;
      compute_nested_disection_order_by_splitting_along_separator<compute_tree_depth_order_of_connected_graph<flow_cutter::ComputeSeparator>(ArrayIDIDFunc,ArrayIDIDFunc,flow_cutter::ComputeSeparator_const&,int)::_lambda(ArrayIDIDFunc,ArrayIDIDFunc)_1_>
                (&local_78,tail,head,(vector<int,_std::allocator<int>_> *)&local_60,&local_48);
      if (local_78.super_ArrayIDFunc<int>.preimage_count_ != 0) {
        iVar1 = compute_tree_depth_of_order(tail,head,&local_78);
        if (iVar1 < local_98) {
          ArrayIDIDFunc::operator=(&local_90,&local_78);
          local_98 = iVar1;
        }
      }
      ArrayIDFunc<int>::~ArrayIDFunc(&local_78.super_ArrayIDFunc<int>);
      tree_depth_must_be_below = local_94;
      iVar1 = local_98;
    }
    piVar2 = local_90.super_ArrayIDFunc<int>.data_;
    iVar3 = local_90.super_ArrayIDFunc<int>.preimage_count_;
    if (tree_depth_must_be_below < iVar1) {
      iVar3 = 0;
      piVar2 = (int *)0x0;
      local_90.image_count_ = 0;
    }
    else {
      local_90.super_ArrayIDFunc<int>.preimage_count_ = 0;
      local_90.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = iVar3;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar2;
    __return_storage_ptr__->image_count_ = local_90.image_count_;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_90.super_ArrayIDFunc<int>);
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order_of_connected_graph(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    bool is_tree = (arc_count == 2 * (node_count - 1));
    bool is_clique = (arc_count == (node_count) * (node_count - 1));

    if (is_tree) {
        return compute_tree_depth_order_of_tree(std::move(tail), std::move(head));
    } else if (is_clique) {
        return identity_permutation(node_count);
    } else {
        ArrayIDIDFunc best_order = compute_greedy_order(tail, head);
        int best_order_depth = compute_tree_depth_of_order(tail, head, best_order);

        // If we computed a separator with size tree_depth_must_be_below or more, then the tree depth would also be at least tree_depth_must_be_below as the separator forms a path.
        // If we computed a separator with size best_order_depth or more, then it cannot be better than best_order_depth as the separator forms a path.
        std::vector<int> separator = compute_separator(tail, head, std::min(tree_depth_must_be_below, best_order_depth) - 1);
        if (!separator.empty()) {
            ArrayIDIDFunc nd_order = compute_nested_disection_order_by_splitting_along_separator(
                tail, head, separator,
                [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head) {
                    return compute_tree_depth_order_of_connected_graph(std::move(sub_tail), std::move(sub_head), compute_separator, std::min(tree_depth_must_be_below, best_order_depth) - 1);
                });
            if(nd_order.preimage_count() != 0){
                int nd_order_depth = compute_tree_depth_of_order(tail, head, nd_order);
                if (nd_order_depth < best_order_depth) {
                    best_order = std::move(nd_order);
                    best_order_depth = nd_order_depth;
                }
            }
        }

        if(best_order_depth > tree_depth_must_be_below)
            return ArrayIDIDFunc();
        else
            return std::move(best_order);
    }
}